

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex-match.c
# Opt level: O0

int regex_compile(regex_t *r,char *regex_text)

{
  bool bVar1;
  char local_1028 [8];
  char error_message [4096];
  int status;
  char *regex_text_local;
  regex_t *r_local;
  
  error_message._4092_4_ = regcomp((regex_t *)r,regex_text,5);
  bVar1 = error_message._4092_4_ != 0;
  if (bVar1) {
    regerror(error_message._4092_4_,(regex_t *)r,local_1028,0x1000);
    printf("Regex error compiling \'%s\': %s\n",regex_text,local_1028);
  }
  r_local._4_4_ = (uint)bVar1;
  return r_local._4_4_;
}

Assistant:

int regex_compile (regex_t * r, const char * regex_text)
{
#ifdef WITH_APPLE
    int status = regcomp (r, regex_text, REG_EXTENDED|REG_ENHANCED|REG_NEWLINE);
#endif
#ifdef WITH_LINUX
    int status = regcomp (r, regex_text, REG_EXTENDED|REG_NEWLINE);
#endif
    if (status != 0)
    {
        char error_message[MAX_ERROR_MSG];
        regerror (status, r, error_message, MAX_ERROR_MSG);
        printf ("Regex error compiling '%s': %s\n",
                regex_text, error_message);
        return 1;
    }
    return 0;
}